

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::RandomBernoulliStaticLayerParams
          (RandomBernoulliStaticLayerParams *this,RandomBernoulliStaticLayerParams *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__RandomBernoulliStaticLayerParams_00410708;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->outputshape_).current_size_ = 0;
  (this->outputshape_).total_size_ = 0;
  (this->outputshape_).rep_ = (Rep *)0x0;
  new_size = (from->outputshape_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->outputshape_,new_size);
    memcpy(((this->outputshape_).rep_)->elements,((from->outputshape_).rep_)->elements,
           (long)(from->outputshape_).current_size_ << 3);
    (this->outputshape_).current_size_ = (from->outputshape_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  this->prob_ = from->prob_;
  this->seed_ = from->seed_;
  return;
}

Assistant:

RandomBernoulliStaticLayerParams::RandomBernoulliStaticLayerParams(const RandomBernoulliStaticLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      outputshape_(from.outputshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&seed_, &from.seed_,
    reinterpret_cast<char*>(&prob_) -
    reinterpret_cast<char*>(&seed_) + sizeof(prob_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.RandomBernoulliStaticLayerParams)
}